

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O3

int kwsysProcessGetTimeoutTime(cmsysProcess *cp,double *userTimeout,kwsysProcessTime *timeoutTime)

{
  long lVar1;
  double dVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  timespec current_timespec;
  timespec local_30;
  
  dVar2 = cp->Timeout;
  if ((0.0 < dVar2) && ((cp->TimeoutTime).tv_sec < 0)) {
    lVar3 = (long)((dVar2 - (double)(long)dVar2) * 1000000.0);
    lVar4 = (cp->StartTime).tv_usec;
    lVar1 = lVar4 + lVar3;
    lVar4 = lVar4 + -1000000 + lVar3;
    if (lVar1 < 1000000) {
      lVar4 = lVar1;
    }
    (cp->TimeoutTime).tv_sec = (ulong)(999999 < lVar1) + (long)dVar2 + (cp->StartTime).tv_sec;
    (cp->TimeoutTime).tv_usec = lVar4;
  }
  lVar1 = (cp->TimeoutTime).tv_usec;
  timeoutTime->tv_sec = (cp->TimeoutTime).tv_sec;
  timeoutTime->tv_usec = lVar1;
  iVar5 = 0;
  if (userTimeout != (double *)0x0) {
    clock_gettime(1,&local_30);
    lVar3 = (long)*userTimeout;
    lVar4 = (long)((*userTimeout - (double)lVar3) * 1000000.0);
    lVar1 = local_30.tv_nsec / 1000 + lVar4;
    lVar4 = lVar4 + -1000000 + local_30.tv_nsec / 1000;
    if (lVar1 < 1000000) {
      lVar4 = lVar1;
    }
    lVar3 = (ulong)(999999 < lVar1) + lVar3 + local_30.tv_sec;
    lVar1 = timeoutTime->tv_sec;
    if (-1 < lVar1) {
      if ((lVar1 <= lVar3) && (lVar3 != lVar1 || timeoutTime->tv_usec <= lVar4)) {
        return 0;
      }
    }
    timeoutTime->tv_sec = lVar3;
    timeoutTime->tv_usec = lVar4;
    iVar5 = 1;
  }
  return iVar5;
}

Assistant:

static int kwsysProcessGetTimeoutTime(kwsysProcess* cp,
                                      const double* userTimeout,
                                      kwsysProcessTime* timeoutTime)
{
  /* The first time this is called, we need to calculate the time at
     which the child will timeout.  */
  if (cp->Timeout > 0 && cp->TimeoutTime.tv_sec < 0) {
    kwsysProcessTime length = kwsysProcessTimeFromDouble(cp->Timeout);
    cp->TimeoutTime = kwsysProcessTimeAdd(cp->StartTime, length);
  }

  /* Start with process timeout.  */
  *timeoutTime = cp->TimeoutTime;

  /* Check if the user timeout is earlier.  */
  if (userTimeout) {
    kwsysProcessTime currentTime = kwsysProcessTimeGetCurrent();
    kwsysProcessTime userTimeoutLength =
      kwsysProcessTimeFromDouble(*userTimeout);
    kwsysProcessTime userTimeoutTime =
      kwsysProcessTimeAdd(currentTime, userTimeoutLength);
    if (timeoutTime->tv_sec < 0 ||
        kwsysProcessTimeLess(userTimeoutTime, *timeoutTime)) {
      *timeoutTime = userTimeoutTime;
      return 1;
    }
  }
  return 0;
}